

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BinaryExpression.hpp
# Opt level: O1

void __thiscall
__gnu_cxx::new_allocator<Kandinsky::LessExpression>::
construct<Kandinsky::LessExpression,Kandinsky::LessExpression_const&>
          (new_allocator<Kandinsky::LessExpression> *this,LessExpression *__p,LessExpression *__args
          )

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  
  (__p->super_BinaryExpression).super_BaseExpression._vptr_BaseExpression =
       (_func_int **)&PTR___cxa_pure_virtual_0010ea68;
  (__p->super_BinaryExpression).m_arg1.
  super___shared_ptr<Kandinsky::BaseExpression,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (__args->super_BinaryExpression).m_arg1.
       super___shared_ptr<Kandinsky::BaseExpression,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  p_Var1 = (__args->super_BinaryExpression).m_arg1.
           super___shared_ptr<Kandinsky::BaseExpression,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
           _M_pi;
  (__p->super_BinaryExpression).m_arg1.
  super___shared_ptr<Kandinsky::BaseExpression,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       p_Var1;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
    }
  }
  (__p->super_BinaryExpression).m_arg2.
  super___shared_ptr<Kandinsky::BaseExpression,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (__args->super_BinaryExpression).m_arg2.
       super___shared_ptr<Kandinsky::BaseExpression,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  p_Var1 = (__args->super_BinaryExpression).m_arg2.
           super___shared_ptr<Kandinsky::BaseExpression,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
           _M_pi;
  (__p->super_BinaryExpression).m_arg2.
  super___shared_ptr<Kandinsky::BaseExpression,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       p_Var1;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
    }
  }
  (__p->super_BinaryExpression).super_BaseExpression._vptr_BaseExpression =
       (_func_int **)&PTR_evaluate_0010ed30;
  return;
}

Assistant:

BinaryExpression(const BaseExpressionPtr& arg1, const BaseExpressionPtr& arg2)
            : m_arg1(arg1), m_arg2(arg2) {}